

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInAscii * __thiscall chrono::ChStreamInAscii::operator>>(ChStreamInAscii *this,int *nVal)

{
  int iVar1;
  string buffer;
  char *local_58;
  undefined8 local_50;
  char local_48 [16];
  string local_38 [32];
  
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = '\0';
  (*(this->super_ChStreamIn)._vptr_ChStreamIn[0xb])(this,&local_58);
  std::__cxx11::string::string(local_38,(string *)&local_58);
  std::__cxx11::string::~string(local_38);
  iVar1 = atoi(local_58);
  *nVal = iVar1;
  std::__cxx11::string::~string((string *)&local_58);
  return this;
}

Assistant:

ChStreamInAscii& ChStreamInAscii::operator>>(int& nVal) {
    std::string buffer;
    *this >> buffer;
    RemoveTrailingCommas(buffer);
    nVal = atoi(buffer.c_str());
    return *this;
}